

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O0

int __thiscall cpp_db::sqlite_result::get_column_index(sqlite_result *this,string *column_name)

{
  bool bVar1;
  pointer pvVar2;
  ostream *poVar3;
  db_exception *this_00;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream message;
  ostream local_1a0 [376];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_20;
  const_iterator pos;
  string *column_name_local;
  sqlite_result *this_local;
  
  pos.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
               )column_name;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->column_names,column_name);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->column_names);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar3 = std::operator<<(local_1a0,"Column \'");
    poVar3 = std::operator<<(poVar3,(string *)
                                    pos.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                    ._M_cur);
    std::operator<<(poVar3,"\' not found!");
    this_00 = (db_exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    db_exception::db_exception(this_00,&local_1e0);
    __cxa_throw(this_00,&db_exception::typeinfo,db_exception::~db_exception);
  }
  pvVar2 = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                         *)&local_20);
  return pvVar2->second;
}

Assistant:

int sqlite_result::get_column_index(const std::string &column_name) const
{
    auto pos = column_names.find(column_name);
    if (pos != column_names.end())
        return pos->second;
    std::stringstream message;
    message << "Column '" << column_name << "' not found!";
    throw db_exception(message.str());
}